

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O2

void Am_Move_Grow_Stop_Method_proc
               (Am_Object *inter,Am_Object *param_2,Am_Object *event_window,Am_Input_Event *ev)

{
  int y;
  uint y_00;
  Am_Input_Char ic_00;
  Am_Value *pAVar1;
  Am_Object object;
  Am_Object command_obj;
  Am_Input_Char ic;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Inter_Location data;
  Am_Inter_Internal_Method inter_method;
  Am_Inter_Location local_40;
  Am_Object local_38;
  
  y = ev->x;
  y_00 = ev->y;
  object.data = (Am_Object_Data *)0x0;
  pAVar1 = Am_Object::Get(inter,0x11a,0);
  Am_Object::operator=(&object,pAVar1);
  ic_00 = ev->input_char;
  command_obj.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object((Am_Object *)&inter_method,(Am_Slot_Key)inter,0xc5);
  Am_Object::operator=(&command_obj,(Am_Object *)&inter_method);
  Am_Object::~Am_Object((Am_Object *)&inter_method);
  move_grow_interim_val
            ((Am_Object *)&data,inter,&command_obj,(int)&object,y,(Am_Object *)(ulong)y_00,
             (Am_Input_Char *)event_window);
  Am_Object::Am_Object(&local_68,inter);
  Am_Object::Am_Object(&local_70,&command_obj);
  Am_Object::Am_Object(&local_78,event_window);
  Am_Object::Am_Object(&local_38,&object);
  Am_Inter_Location::Am_Inter_Location(&local_40,&data);
  Am_Call_Final_Do_And_Register
            (&local_68,&local_70,y,y_00,&local_78,ic_00,(Am_Object_Data *)&local_38,
             (Am_Inter_Location_Data *)&local_40,move_grow_set_impl_command);
  Am_Inter_Location::~Am_Inter_Location(&local_40);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_68);
  inter_method.from_wrapper = (Am_Method_Wrapper *)0x0;
  inter_method.Call = (Am_Inter_Internal_Method_Type *)0x0;
  pAVar1 = Am_Object::Get(&Am_Interactor,0xc2,0);
  Am_Inter_Internal_Method::operator=(&inter_method,pAVar1);
  (*inter_method.Call)(inter,&object,event_window,ev);
  Am_Inter_Location::~Am_Inter_Location(&data);
  Am_Object::~Am_Object(&command_obj);
  Am_Object::~Am_Object(&object);
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Move_Grow_Stop_Method,
                 (Am_Object & inter, Am_Object & /* object */,
                  Am_Object &event_window, Am_Input_Event *ev))
{
  int x = ev->x;
  int y = ev->y;
  // ignore object parameter, used saved object
  Am_Object object;
  object = inter.Get(Am_START_OBJECT);
  Am_INTER_TRACE_PRINT(inter, "Move_Grow stopping over " << object);
  //now, call interim_do on last point
  Am_Input_Char ic = ev->input_char;
  Am_Object command_obj;
  command_obj = inter.Get_Object(Am_COMMAND);
  Am_Inter_Location data =
      move_grow_interim_val(inter, command_obj, object, x, y, event_window, ic);

  // call DO method
  //data is points calculated by move_grow_interim_val
  Am_Call_Final_Do_And_Register(inter, command_obj, x, y, event_window, ic,
                                object, data, move_grow_set_impl_command);

  // LAST, call the prototype's method
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_STOP_METHOD);
  inter_method.Call(inter, object, event_window, ev);
}